

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O1

int dwarf_dnames_header(Dwarf_Debug dbg,Dwarf_Off starting_offset,Dwarf_Dnames_Head *dn_out,
                       Dwarf_Off *offset_of_next_table,Dwarf_Error *error)

{
  ulong uVar1;
  int iVar2;
  Dwarf_Unsigned remaining_space;
  Dwarf_Dnames_Head dn;
  char *msg;
  Dwarf_Signed errval;
  Dwarf_Small *pDVar3;
  Dwarf_Unsigned next_offset;
  Dwarf_Unsigned usedspace;
  Dwarf_Small *local_40;
  Dwarf_Small *local_38;
  
  usedspace = 0;
  next_offset = 0;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_dnames_header()either null or it containsa stale Dwarf_Debug pointer"
                       );
    return 1;
  }
  iVar2 = _dwarf_load_section(dbg,&dbg->de_debug_names,error);
  if (iVar2 != 0) {
    return iVar2;
  }
  uVar1 = (dbg->de_debug_names).dss_size;
  if (uVar1 != 0) {
    iVar2 = _dwarf_load_section(dbg,&dbg->de_debug_str,error);
    if (iVar2 == 1) {
      return 1;
    }
    remaining_space = uVar1 - starting_offset;
    if (starting_offset <= uVar1 && remaining_space != 0) {
      local_38 = (dbg->de_debug_names).dss_data + starting_offset;
      dn = (Dwarf_Dnames_Head)_dwarf_get_alloc(dbg,'?',1);
      pDVar3 = local_38;
      if (dn == (Dwarf_Dnames_Head)0x0) {
        msg = "DW_DLE_ALLOC_FAIL: dwarf_get_alloc of a Dwarf_Dnames_Head record failed.";
        errval = 0x3e;
      }
      else {
        local_40 = local_38 + uVar1;
        dn->dn_magic = 0xabcd;
        dn->dn_section_data = local_38;
        dn->dn_section_size = uVar1;
        dn->dn_section_end = local_40;
        dn->dn_dbg = dbg;
        dn->dn_section_offset = starting_offset;
        dn->dn_indextable_data = local_38 + starting_offset;
        iVar2 = read_a_name_table_header
                          (dn,starting_offset,remaining_space,local_38,&usedspace,&next_offset,
                           local_40,error);
        if (iVar2 == -1) {
          dwarf_dealloc_dnames(dn);
          return -1;
        }
        if (iVar2 == 1) {
          dwarf_dealloc_dnames(dn);
          return 1;
        }
        if (usedspace <= uVar1) {
          if (((long)usedspace < (long)uVar1 && remaining_space != usedspace) &&
              remaining_space - usedspace < 0xf) {
            pDVar3 = pDVar3 + usedspace;
            do {
              if (*pDVar3 != '\0') {
                dwarf_dealloc(dbg,dn,0x3f);
                msg = "DW_DLE_DEBUG_NAMES_PAD_NON_ZERO: space at end of valid tables not zeros";
                errval = 0x176;
                goto LAB_0019ae6e;
              }
              pDVar3 = pDVar3 + 1;
            } while (pDVar3 < local_40);
          }
          *dn_out = dn;
          *offset_of_next_table = next_offset;
          return 0;
        }
        dwarf_dealloc_dnames(dn);
        msg = "DW_DLE_DEBUG_NAMES_OFF_END:  used space > section size";
        errval = 0x177;
      }
LAB_0019ae6e:
      _dwarf_error_string(dbg,error,errval,msg);
      return 1;
    }
  }
  return -1;
}

Assistant:

int
dwarf_dnames_header(Dwarf_Debug dbg,
    Dwarf_Off           starting_offset,
    Dwarf_Dnames_Head * dn_out,
    Dwarf_Off         * offset_of_next_table,
    Dwarf_Error       * error)
{
    Dwarf_Unsigned    remaining    = 0;
    Dwarf_Dnames_Head dn           = 0;
    Dwarf_Unsigned    section_size = 0;
    Dwarf_Unsigned    usedspace    = 0;
    Dwarf_Unsigned    next_offset  = 0;
    Dwarf_Small      *start_section= 0;
    Dwarf_Small      *end_section  = 0;
    Dwarf_Small      *curptr       = 0;
    int              res           = 0;

    CHECK_DBG(dbg,error,"dwarf_dnames_header()");
    res = _dwarf_load_section(dbg, &dbg->de_debug_names, error);
    if (res != DW_DLV_OK) {
        return res;
    }
    section_size = dbg->de_debug_names.dss_size;
    if (!section_size){
        return DW_DLV_NO_ENTRY;
    }
    res = _dwarf_load_section(dbg, &dbg->de_debug_str,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (starting_offset >= section_size) {
        return DW_DLV_NO_ENTRY;
    }
    start_section = dbg->de_debug_names.dss_data;
    curptr = start_section += starting_offset;
    end_section = start_section + section_size;
    dn =  (Dwarf_Dnames_Head)_dwarf_get_alloc(dbg,
        DW_DLA_DNAMES_HEAD, 1);
    if (!dn) {
        _dwarf_error_string(dbg, error, DW_DLE_ALLOC_FAIL,
            "DW_DLE_ALLOC_FAIL: dwarf_get_alloc of "
            "a Dwarf_Dnames_Head record failed.");
        return DW_DLV_ERROR;
    }
    dn->dn_magic = DWARF_DNAMES_MAGIC;
    dn->dn_section_data = start_section;
    dn->dn_section_size = section_size;
    dn->dn_section_end = start_section + section_size;
    dn->dn_dbg = dbg;
    dn->dn_section_offset = starting_offset;
    dn->dn_indextable_data = starting_offset + start_section;;
    remaining = dn->dn_section_size - starting_offset;
    res = read_a_name_table_header(dn,
        starting_offset,
        remaining,
        curptr,
        &usedspace,
        &next_offset,
        dn->dn_section_end,
        error);
    if (res == DW_DLV_ERROR) {
        dwarf_dealloc_dnames(dn);
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        /*  Impossible. A bug. Or possibly
            a bunch of zero pad? */
        dwarf_dealloc_dnames(dn);
        return res;
    }
    if (usedspace > section_size) {
        dwarf_dealloc_dnames(dn);
        _dwarf_error_string(dbg, error,DW_DLE_DEBUG_NAMES_OFF_END,
            "DW_DLE_DEBUG_NAMES_OFF_END: "
            " used space > section size");
        return DW_DLV_ERROR;
    }
    remaining -= usedspace;
    if (remaining && remaining < 15) {
        /*  No more content in here, just padding. Check for zero
            in padding. */
        curptr += usedspace;
        for ( ; curptr < end_section; ++curptr) {
            if (*curptr) {
                /*  One could argue this is a harmless error,
                    but for now assume it is real corruption. */
                dwarf_dealloc(dbg,dn,DW_DLA_DNAMES_HEAD);
                _dwarf_error_string(dbg, error,
                    DW_DLE_DEBUG_NAMES_PAD_NON_ZERO,
                    "DW_DLE_DEBUG_NAMES_PAD_NON_ZERO: "
                    "space at end of valid tables not zeros");
                return DW_DLV_ERROR;
            }
        }
    }
    *dn_out = dn;
    *offset_of_next_table = next_offset;
    return DW_DLV_OK;
}